

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipatchtexture.cpp
# Opt level: O0

void __thiscall FMultiPatchTexture::CheckForHacks(FMultiPatchTexture *this)

{
  FTexture *pFVar1;
  char *pcVar2;
  int local_14;
  int i;
  FMultiPatchTexture *this_local;
  
  if (0 < this->NumParts) {
    if (((((gameinfo.gametype == GAME_Heretic) &&
          (pcVar2 = FString::operator[](&(this->super_FTexture).Name,0), *pcVar2 == 'S')) &&
         (pcVar2 = FString::operator[](&(this->super_FTexture).Name,1), *pcVar2 == 'K')) &&
        ((pcVar2 = FString::operator[](&(this->super_FTexture).Name,2), *pcVar2 == 'Y' &&
         (pcVar2 = FString::operator[](&(this->super_FTexture).Name,4), *pcVar2 == '\0')))) &&
       ((pcVar2 = FString::operator[](&(this->super_FTexture).Name,3), '0' < *pcVar2 &&
        ((pcVar2 = FString::operator[](&(this->super_FTexture).Name,3), *pcVar2 < '4' &&
         ((this->super_FTexture).Height == 0x80)))))) {
      (this->super_FTexture).Height = 200;
      (this->super_FTexture).HeightBits = '\b';
    }
    else if (((((gameinfo.gametype == GAME_Doom) && ((gameinfo.flags & 1U) == 0)) &&
              (this->NumParts == 1)) &&
             ((((this->super_FTexture).Height == 0x80 && (this->Parts->OriginY == -8)) &&
              ((pcVar2 = FString::operator[](&(this->super_FTexture).Name,0), *pcVar2 == 'S' &&
               ((pcVar2 = FString::operator[](&(this->super_FTexture).Name,1), *pcVar2 == 'K' &&
                (pcVar2 = FString::operator[](&(this->super_FTexture).Name,2), *pcVar2 == 'Y')))))))
             ) && ((pcVar2 = FString::operator[](&(this->super_FTexture).Name,3), *pcVar2 == '1' &&
                   (pcVar2 = FString::operator[](&(this->super_FTexture).Name,4), *pcVar2 == '\0')))
            ) {
      this->Parts->OriginY = 0;
    }
    else if ((((gameinfo.gametype == GAME_Doom) && ((gameinfo.flags & 1U) == 0)) &&
             (this->NumParts == 2)) &&
            ((((this->super_FTexture).Height == 0x80 && (this->Parts->OriginY == -4)) &&
             ((((this->Parts[1].OriginY == -4 &&
                ((pcVar2 = FString::operator[](&(this->super_FTexture).Name,0), *pcVar2 == 'B' &&
                 (pcVar2 = FString::operator[](&(this->super_FTexture).Name,1), *pcVar2 == 'I'))))
               && (pcVar2 = FString::operator[](&(this->super_FTexture).Name,2), *pcVar2 == 'G')) &&
              ((((pcVar2 = FString::operator[](&(this->super_FTexture).Name,3), *pcVar2 == 'D' &&
                 (pcVar2 = FString::operator[](&(this->super_FTexture).Name,4), *pcVar2 == 'O')) &&
                (pcVar2 = FString::operator[](&(this->super_FTexture).Name,5), *pcVar2 == 'O')) &&
               ((pcVar2 = FString::operator[](&(this->super_FTexture).Name,6), *pcVar2 == 'R' &&
                (pcVar2 = FString::operator[](&(this->super_FTexture).Name,7), *pcVar2 == '7')))))))
             ))) {
      this->Parts->OriginY = 0;
      this->Parts[1].OriginY = 0;
    }
    else if ((this->super_FTexture).Height == 0x100) {
      local_14 = 0;
      while ((local_14 < this->NumParts && (this->Parts[local_14].OriginY == 0))) {
        local_14 = local_14 + 1;
      }
      if (local_14 == this->NumParts) {
        for (local_14 = 0; local_14 < this->NumParts; local_14 = local_14 + 1) {
          pFVar1 = this->Parts[local_14].Texture;
          (*pFVar1->_vptr_FTexture[0xe])(pFVar1,0x100);
        }
      }
    }
  }
  return;
}

Assistant:

void FMultiPatchTexture::CheckForHacks ()
{
	if (NumParts <= 0)
	{
		return;
	}

	// Heretic sky textures are marked as only 128 pixels tall,
	// even though they are really 200 pixels tall.
	if (gameinfo.gametype == GAME_Heretic &&
		Name[0] == 'S' &&
		Name[1] == 'K' &&
		Name[2] == 'Y' &&
		Name[4] == 0 &&
		Name[3] >= '1' &&
		Name[3] <= '3' &&
		Height == 128)
	{
		Height = 200;
		HeightBits = 8;
		return;
	}

	// The Doom E1 sky has its patch's y offset at -8 instead of 0.
	if (gameinfo.gametype == GAME_Doom &&
		!(gameinfo.flags & GI_MAPxx) &&
		NumParts == 1 &&
		Height == 128 &&
		Parts->OriginY == -8 &&
		Name[0] == 'S' &&
		Name[1] == 'K' &&
		Name[2] == 'Y' &&
		Name[3] == '1' &&
		Name[4] == 0)
	{
		Parts->OriginY = 0;
		return;
	}

	// BIGDOOR7 in Doom also has patches at y offset -4 instead of 0.
	if (gameinfo.gametype == GAME_Doom &&
		!(gameinfo.flags & GI_MAPxx) &&
		NumParts == 2 &&
		Height == 128 &&
		Parts[0].OriginY == -4 &&
		Parts[1].OriginY == -4 &&
		Name[0] == 'B' &&
		Name[1] == 'I' &&
		Name[2] == 'G' &&
		Name[3] == 'D' &&
		Name[4] == 'O' &&
		Name[5] == 'O' &&
		Name[6] == 'R' &&
		Name[7] == '7')
	{
		Parts[0].OriginY = 0;
		Parts[1].OriginY = 0;
		return;
	}

	// [RH] Some wads (I forget which!) have single-patch textures 256
	// pixels tall that have patch lengths recorded as 0. I can't think of
	// any good reason for them to do this, and since I didn't make note
	// of which wad made me hack in support for them, the hack is gone
	// because I've added support for DeePsea's true tall patches.
	//
	// Okay, I found a wad with crap patches: Pleiades.wad's sky patches almost
	// fit this description and are a big mess, but they're not single patch!
	if (Height == 256)
	{
		int i;

		// All patches must be at the top of the texture for this fix
		for (i = 0; i < NumParts; ++i)
		{
			if (Parts[i].OriginY != 0)
			{
				break;
			}
		}

		if (i == NumParts)
		{
			for (i = 0; i < NumParts; ++i)
			{
				Parts[i].Texture->HackHack(256);
			}
		}
	}
}